

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl_fileutils.c
# Opt level: O2

mcu8str_size_t mctools_strlen(char *c_str,mcu8str_size_t nmax)

{
  void *pvVar1;
  mcu8str_size_t mVar2;
  size_t __n;
  
  __n = 0xffffffff;
  if (nmax != 0) {
    __n = nmax;
  }
  if (-1 < (long)__n) {
    pvVar1 = memchr(c_str,0,__n);
    mVar2 = (long)pvVar1 - (long)c_str;
    if (pvVar1 == (void *)0x0) {
      mVar2 = __n;
    }
    if (mVar2 < 0xfffffffe) {
      return mVar2;
    }
  }
  mctools_impl_error("str length out of range");
}

Assistant:

mcu8str_size_t mctools_strlen( const char * c_str, mcu8str_size_t nmax )
  {
    //safe strlen which guarantees result can fit in an unsigned integer (or
    //less, when 0<nmax<UINT_MAX is provided).
    if ( nmax == 0 )
      nmax = ( UINT_MAX > PTRDIFF_MAX ? PTRDIFF_MAX : UINT_MAX );

    if ( nmax > PTRDIFF_MAX )
      mctools_impl_error("str length out of range");

    const char * nullchr = (const char *) STDNS memchr( c_str, '\0', nmax );
    mcu8str_size_t o_size;
    if ( nullchr )
      o_size = nullchr - c_str;
    else
      o_size = nmax;
    if ( !MCTOOLS_STROKFORUINT(o_size) )
      mctools_impl_error("str length out of range");
    return o_size;
  }